

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O2

wchar_t mon_create_drop_count(monster_race *race,_Bool maximize,_Bool specific,int *specific_count)

{
  bitflag *flags;
  _Bool _Var1;
  _Bool _Var2;
  uint32_t uVar3;
  int iVar4;
  undefined7 in_register_00000031;
  int iVar5;
  uint uVar6;
  int iVar7;
  monster_drop *pmVar8;
  
  flags = race->flags;
  _Var1 = flag_has_dbg(flags,0xb,0x27,"race->flags","RF_DROP_20");
  if ((int)CONCAT71(in_register_00000031,maximize) == 0) {
    uVar6 = 0;
    if (_Var1) {
      uVar3 = Rand_div(100);
      uVar6 = (uint)((int)uVar3 < 0x14);
    }
    _Var1 = flag_has_dbg(flags,0xb,0x1f,"race->flags","RF_DROP_40");
    if (_Var1) {
      uVar3 = Rand_div(100);
      uVar6 = uVar6 + ((int)uVar3 < 0x28);
    }
    _Var1 = flag_has_dbg(flags,0xb,0x20,"race->flags","RF_DROP_60");
    if (_Var1) {
      uVar3 = Rand_div(100);
      uVar6 = uVar6 + ((int)uVar3 < 0x3c);
    }
    _Var1 = flag_has_dbg(flags,0xb,0x24,"race->flags","RF_DROP_4");
    if (_Var1) {
      iVar5 = rand_range(2,6);
      uVar6 = uVar6 + iVar5;
    }
    _Var1 = flag_has_dbg(flags,0xb,0x23,"race->flags","RF_DROP_3");
    if (_Var1) {
      iVar5 = rand_range(2,4);
      uVar6 = uVar6 + iVar5;
    }
    _Var1 = flag_has_dbg(flags,0xb,0x22,"race->flags","RF_DROP_2");
    if (_Var1) {
      iVar5 = rand_range(1,3);
      uVar6 = uVar6 + iVar5;
    }
    _Var1 = flag_has_dbg(flags,0xb,0x21,"race->flags","RF_DROP_1");
    pmVar8 = (monster_drop *)&race->drops;
    iVar5 = 0;
    while (pmVar8 = pmVar8->next, pmVar8 != (monster_drop *)0x0) {
      uVar3 = Rand_div(100);
      if (uVar3 < pmVar8->percent_chance) {
        uVar3 = Rand_div(pmVar8->max - pmVar8->min);
        iVar5 = uVar3 + iVar5 + pmVar8->min;
      }
    }
    iVar7 = uVar6 + _Var1;
  }
  else {
    _Var2 = flag_has_dbg(flags,0xb,0x1f,"race->flags","RF_DROP_40");
    uVar6 = _Var1 + 1;
    if (!_Var2) {
      uVar6 = (uint)_Var1;
    }
    _Var1 = flag_has_dbg(flags,0xb,0x20,"race->flags","RF_DROP_60");
    _Var2 = flag_has_dbg(flags,0xb,0x24,"race->flags","RF_DROP_4");
    iVar5 = uVar6 + _Var1 + 6;
    if (!_Var2) {
      iVar5 = uVar6 + _Var1;
    }
    _Var1 = flag_has_dbg(flags,0xb,0x23,"race->flags","RF_DROP_3");
    iVar7 = iVar5 + 4;
    if (!_Var1) {
      iVar7 = iVar5;
    }
    _Var1 = flag_has_dbg(flags,0xb,0x22,"race->flags","RF_DROP_2");
    _Var2 = flag_has_dbg(flags,0xb,0x21,"race->flags","RF_DROP_1");
    pmVar8 = (monster_drop *)&race->drops;
    iVar5 = 0;
    while (pmVar8 = pmVar8->next, pmVar8 != (monster_drop *)0x0) {
      iVar5 = iVar5 + pmVar8->max;
    }
    if (_Var1) {
      iVar7 = iVar7 + 3;
    }
    iVar7 = iVar7 + (uint)_Var2;
  }
  if (specific_count != (int *)0x0) {
    *specific_count = iVar5;
  }
  iVar4 = 0;
  if (specific) {
    iVar4 = iVar5;
  }
  return iVar4 + iVar7;
}

Assistant:

int mon_create_drop_count(const struct monster_race *race, bool maximize,
	bool specific, int *specific_count)
{
	int number = 0;
	int specnum = 0;
	static const int drop_4_max = 6;
	static const int drop_3_max = 4;
	static const int drop_2_max = 3;
	struct monster_drop *drop;

	if (maximize) {
		if (rf_has(race->flags, RF_DROP_20)) number++;
		if (rf_has(race->flags, RF_DROP_40)) number++;
		if (rf_has(race->flags, RF_DROP_60)) number++;
		if (rf_has(race->flags, RF_DROP_4)) number += drop_4_max;
		if (rf_has(race->flags, RF_DROP_3)) number += drop_3_max;
		if (rf_has(race->flags, RF_DROP_2)) number += drop_2_max;
		if (rf_has(race->flags, RF_DROP_1)) number++;
		for (drop = race->drops; drop; drop = drop->next) {
			specnum += drop->max;
		}
	} else {
		if (rf_has(race->flags, RF_DROP_20) && randint0(100) < 20) number++;
		if (rf_has(race->flags, RF_DROP_40) && randint0(100) < 40) number++;
		if (rf_has(race->flags, RF_DROP_60) && randint0(100) < 60) number++;
		if (rf_has(race->flags, RF_DROP_4)) number += rand_range(2, drop_4_max);
		if (rf_has(race->flags, RF_DROP_3)) number += rand_range(2, drop_3_max);
		if (rf_has(race->flags, RF_DROP_2)) number += rand_range(1, drop_2_max);
		if (rf_has(race->flags, RF_DROP_1)) number++;
		for (drop = race->drops; drop; drop = drop->next) {
			if ((unsigned int)randint0(100) <
					drop->percent_chance) {
				specnum += randint0(drop->max - drop->min) +
					drop->min;
			}
		}
	}
	if (specific) {
		number += specnum;
	}
	if (specific_count) {
		*specific_count = specnum;
	}
	return number;
}